

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_asm.cpp
# Opt level: O3

QpAsmStatus
solveqp_actual(Instance *instance,Settings *settings,QpHotstartInformation *startinfo,
              Statistics *stats,QpModelStatus *status,QpSolution *solution,HighsTimer *qp_timer)

{
  undefined4 uVar1;
  long lVar2;
  Settings *pSVar3;
  Settings *pSVar4;
  byte bVar5;
  Runtime rt;
  Basis basis;
  Quass local_15d0;
  vector<int,_std::allocator<int>_> local_15c8;
  vector<BasisStatus,_std::allocator<BasisStatus>_> local_15b0;
  vector<int,_std::allocator<int>_> local_1598;
  Runtime local_1580;
  Basis local_b88;
  
  bVar5 = 0;
  Runtime::Runtime(&local_1580,instance,stats);
  pSVar3 = settings;
  pSVar4 = &local_1580.settings;
  for (lVar2 = 0xc; lVar2 != 0; lVar2 = lVar2 + -1) {
    uVar1 = *(undefined4 *)&pSVar3->field_0x4;
    pSVar4->ratiotest = pSVar3->ratiotest;
    *(undefined4 *)&pSVar4->field_0x4 = uVar1;
    pSVar3 = (Settings *)((long)pSVar3 + (ulong)bVar5 * -0x10 + 8);
    pSVar4 = (Settings *)((long)pSVar4 + ((ulong)bVar5 * -2 + 1) * 8);
  }
  local_1580.settings.reportingfequency = settings->reportingfequency;
  std::
  vector<std::function<void_(Statistics_&)>,_std::allocator<std::function<void_(Statistics_&)>_>_>::
  operator=(&local_1580.settings.iteration_log.subscribers,&(settings->iteration_log).subscribers);
  std::
  vector<std::function<void_(QpModelStatus_&)>,_std::allocator<std::function<void_(QpModelStatus_&)>_>_>
  ::operator=(&local_1580.settings.qp_model_status_log.subscribers,
              &(settings->qp_model_status_log).subscribers);
  std::vector<std::function<void_(int_&)>,_std::allocator<std::function<void_(int_&)>_>_>::operator=
            (&local_1580.settings.nullspace_limit_log.subscribers,
             &(settings->nullspace_limit_log).subscribers);
  local_1580.settings.nullspace_limit = settings->nullspace_limit;
  local_1580.settings.reinvertfrequency = settings->reinvertfrequency;
  local_1580.settings.gradientrecomputefrequency = settings->gradientrecomputefrequency;
  local_1580.settings.reducedgradientrecomputefrequency =
       settings->reducedgradientrecomputefrequency;
  local_1580.settings.reducedhessianrecomputefrequency = settings->reducedhessianrecomputefrequency;
  local_1580.settings.iteration_limit = settings->iteration_limit;
  local_1580.settings.time_limit._0_7_ = SUB87(settings->time_limit,0);
  local_1580.settings._208_3_ = SUB43((uint)*(undefined4 *)((long)&settings->time_limit + 7) >> 8,0)
  ;
  local_1580.settings.time_limit._7_1_ = (undefined1)((ulong)settings->time_limit >> 0x38);
  Quass::Quass(&local_15d0,&local_1580);
  std::vector<int,_std::allocator<int>_>::vector(&local_1598,&startinfo->active);
  std::vector<BasisStatus,_std::allocator<BasisStatus>_>::vector(&local_15b0,&startinfo->status);
  std::vector<int,_std::allocator<int>_>::vector(&local_15c8,&startinfo->inactive);
  Basis::Basis(&local_b88,&local_1580,&local_1598,&local_15b0,&local_15c8);
  if (local_15c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_15c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_15b0.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_15b0.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  if (local_1598.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1598.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  Quass::solve(&local_15d0,&startinfo->primal,&startinfo->rowact,&local_b88,qp_timer);
  *status = local_1580.status;
  std::vector<BasisStatus,_std::allocator<BasisStatus>_>::operator=
            (&solution->status_var,&local_1580.status_var);
  std::vector<BasisStatus,_std::allocator<BasisStatus>_>::operator=
            (&solution->status_con,&local_1580.status_con);
  (solution->primal).num_nz = local_1580.primal.num_nz;
  (solution->primal).dim = local_1580.primal.dim;
  std::vector<int,_std::allocator<int>_>::operator=
            (&(solution->primal).index,&local_1580.primal.index);
  std::vector<double,_std::allocator<double>_>::operator=
            (&(solution->primal).value,&local_1580.primal.value);
  (solution->dualvar).num_nz = local_1580.dualvar.num_nz;
  (solution->dualvar).dim = local_1580.dualvar.dim;
  std::vector<int,_std::allocator<int>_>::operator=
            (&(solution->dualvar).index,&local_1580.dualvar.index);
  std::vector<double,_std::allocator<double>_>::operator=
            (&(solution->dualvar).value,&local_1580.dualvar.value);
  (solution->rowactivity).num_nz = local_1580.rowactivity.num_nz;
  (solution->rowactivity).dim = local_1580.rowactivity.dim;
  std::vector<int,_std::allocator<int>_>::operator=
            (&(solution->rowactivity).index,&local_1580.rowactivity.index);
  std::vector<double,_std::allocator<double>_>::operator=
            (&(solution->rowactivity).value,&local_1580.rowactivity.value);
  (solution->dualcon).num_nz = local_1580.dualcon.num_nz;
  (solution->dualcon).dim = local_1580.dualcon.dim;
  std::vector<int,_std::allocator<int>_>::operator=
            (&(solution->dualcon).index,&local_1580.dualcon.index);
  std::vector<double,_std::allocator<double>_>::operator=
            (&(solution->dualcon).value,&local_1580.dualcon.value);
  Basis::~Basis(&local_b88);
  Runtime::~Runtime(&local_1580);
  return kOk;
}

Assistant:

QpAsmStatus solveqp_actual(Instance& instance, Settings& settings,
                           QpHotstartInformation& startinfo, Statistics& stats,
                           QpModelStatus& status, QpSolution& solution,
                           HighsTimer& qp_timer) {
  Runtime rt(instance, stats);
  rt.settings = settings;
  Quass quass(rt);

  Basis basis(rt, startinfo.active, startinfo.status, startinfo.inactive);

  quass.solve(startinfo.primal, startinfo.rowact, basis, qp_timer);

  status = rt.status;

  solution.status_var = rt.status_var;
  solution.status_con = rt.status_con;
  solution.primal = rt.primal;
  solution.dualvar = rt.dualvar;
  solution.rowactivity = rt.rowactivity;
  solution.dualcon = rt.dualcon;

  return QpAsmStatus::kOk;
}